

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int height;
  _Bool _Var1;
  int iVar2;
  ImageBuffer *buffer;
  SDL_Window *window;
  char *title;
  char *filepath;
  Options options;
  Options local_50;
  
  local_50.width = 200;
  local_50.height = 200;
  local_50.max_samples._0_4_ = -1;
  local_50.max_samples._4_4_ = 0xffffffff;
  local_50.max_seconds._0_4_ = -1;
  local_50.max_seconds._4_4_ = 0xffffffff;
  local_50.output_file = (char *)0x0;
  local_50.uniform_sampling = false;
  _Var1 = parse_args(argc,argv,&local_50);
  iVar2 = -1;
  if (_Var1) {
    iVar2 = (int)local_50.width;
    height = (int)local_50.height;
    buffer = create_buffer((int)local_50.width,(int)local_50.height);
    title = "Pathtracer";
    if (local_50.output_file != (char *)0x0) {
      title = local_50.output_file;
    }
    filepath = "output/latest.png";
    if (local_50.output_file != (char *)0x0) {
      filepath = local_50.output_file;
    }
    window = create_window(title,iVar2,height);
    render_buffer(window,buffer,2.2);
    render_stuff(buffer,window,(int)local_50.max_samples,(int)local_50.max_seconds,
                 local_50.uniform_sampling);
    putchar(10);
    write_image_file(buffer,filepath,2.2);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
    /* TriangleMesh suzanne; */
    /* read_obj_file(&suzanne, "res/suzanne_250k.obj"); */

    /* for (int i = 0; i < suzanne.triangle_count; i++) { */
    /* 	printf("Triangle %d:\n", i); */
    /* 	Triangle* tri = &suzanne.triangles[i]; */
    /* 	for (int j = 0; j < 3; j++) { */
    /* 	    printf("  v %6.3f %6.3f %6.3f\t", tri->vertices[j].x, tri->vertices[j].y, tri->vertices[j].z); */
    /* 	    printf("  n %6.3f %6.3f %6.3f\n", tri->vertex_normals[j].x, tri->vertex_normals[j].y, tri->vertex_normals[j].z); */
    /* 	} */
    /* } */
    
    /* return 0; */
    
    Options options = default_options();
    if (!parse_args(argc, argv, &options)) {
        return -1;
    }
    ImageBuffer* buf = create_buffer(options.width, options.height);

    SDL_Window* window = create_window(options.output_file ? options.output_file : "Pathtracer", options.width, options.height);

    render_buffer(window, buf, GAMMA);
    render_stuff(buf, window, options.max_samples, options.max_seconds, options.uniform_sampling);
    printf("\n");

    if (options.output_file)
        write_image_file(buf, options.output_file, GAMMA);
    else
        write_image_file(buf, "output/latest.png", GAMMA);
}